

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_solution.hpp
# Opt level: O2

Spins * __thiscall
openjij::result::get_solution<openjij::graph::Dense<double>>
          (Spins *__return_storage_ptr__,result *this,
          ClassicalIsing<openjij::graph::Dense<double>_> *system)

{
  CoeffReturnType pdVar1;
  size_t i;
  ulong index;
  allocator_type local_21;
  double local_20;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,*(size_type *)(this + 0x28),&local_21);
  for (index = 0; index < *(ulong *)(this + 0x28); index = index + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this,index);
    local_20 = *pdVar1;
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this,
                        *(Index *)(this + 0x28));
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start[index] = (int)(local_20 * *pdVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

const graph::Spins
get_solution(const system::ClassicalIsing<GraphType> &system) {
  // convert from Eigen::Vector to std::vector
  graph::Spins ret_spins(system.num_spins);
  for (std::size_t i = 0; i < system.num_spins; i++) {
    ret_spins[i] = static_cast<graph::Spin>(system.spin(i) *
                                            system.spin(system.num_spins));
  }
  return ret_spins;
}